

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::stringify<C_A_T_C_H_T_E_S_T_0()::base*>
          (string *__return_storage_ptr__,Detail *this,base **e)

{
  size_t in_RCX;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)this;
  if (local_10 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nullptr",&local_11);
  }
  else {
    rawMemoryToString_abi_cxx11_
              ((string *)__return_storage_ptr__,(Detail *)&local_10,(void *)0x8,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<typename std::remove_cv<typename std::remove_reference<T>::type>::type>::convert(e);
        }